

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::TrimeshPrimitiveManager
          (TrimeshPrimitiveManager *this)

{
  undefined1 auVar1 [16];
  
  (this->super_cbtPrimitiveManagerBase)._vptr_cbtPrimitiveManagerBase =
       (_func_int **)&PTR__cbtPrimitiveManagerBase_011987f0;
  this->m_meshInterface = (cbtStridingMeshInterface *)0x0;
  this->m_part = 0;
  this->m_margin = 0.01;
  (this->m_scale).m_floats[0] = 1.0;
  (this->m_scale).m_floats[1] = 1.0;
  (this->m_scale).m_floats[2] = 1.0;
  (this->m_scale).m_floats[3] = 0.0;
  this->stride = 0;
  auVar1 = ZEXT816(0) << 0x20;
  this->m_lock_count = auVar1._0_4_;
  this->vertexbase = (uchar *)auVar1._4_8_;
  this->numverts = auVar1._12_4_;
  this->indexbase = (uchar *)auVar1._0_8_;
  this->indexstride = auVar1._8_4_;
  this->numfaces = auVar1._12_4_;
  return;
}

Assistant:

TrimeshPrimitiveManager()
		{
			m_meshInterface = NULL;
			m_part = 0;
			m_margin = 0.01f;
			m_scale = cbtVector3(1.f, 1.f, 1.f);
			m_lock_count = 0;
			vertexbase = 0;
			numverts = 0;
			stride = 0;
			indexbase = 0;
			indexstride = 0;
			numfaces = 0;
		}